

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encryption_state.cpp
# Opt level: O2

void __thiscall
duckdb::EncryptionState::GenerateRandomData(EncryptionState *this,data_ptr_t data,idx_t len)

{
  NotImplementedException *this_00;
  allocator local_39;
  string local_38;
  
  this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"EncryptionState Abstract Class is called",&local_39);
  NotImplementedException::NotImplementedException(this_00,&local_38);
  __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void EncryptionState::GenerateRandomData(duckdb::data_ptr_t data, duckdb::idx_t len) {
	throw NotImplementedException("EncryptionState Abstract Class is called");
}